

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mfsSat.c
# Opt level: O0

int Abc_NtkAddOneHotness(Mfs_Man_t *p)

{
  int iVar1;
  int iVar2;
  Aig_Obj_t *pAVar3;
  Aig_Obj_t *pAVar4;
  lit local_38;
  lit local_34;
  int Lits [2];
  int k;
  int i;
  Aig_Obj_t *pObj2;
  Aig_Obj_t *pObj1;
  Mfs_Man_t *p_local;
  
  Lits[1] = 0;
  do {
    iVar2 = Lits[1];
    iVar1 = Vec_PtrSize(p->pAigWin->vCis);
    Lits[0] = Lits[1];
    if (iVar1 <= iVar2) {
      return 1;
    }
    while( true ) {
      Lits[0] = Lits[0] + 1;
      iVar2 = Lits[0];
      iVar1 = Vec_PtrSize(p->pAigWin->vCis);
      if (iVar1 <= iVar2) break;
      pAVar3 = Aig_ManCi(p->pAigWin,Lits[1]);
      pAVar4 = Aig_ManCi(p->pAigWin,Lits[0]);
      local_38 = toLitCond(p->pCnf->pVarNums[pAVar3->Id],1);
      local_34 = toLitCond(p->pCnf->pVarNums[pAVar4->Id],1);
      iVar2 = sat_solver_addclause(p->pSat,&local_38,Lits);
      if (iVar2 == 0) {
        sat_solver_delete(p->pSat);
        p->pSat = (sat_solver *)0x0;
        return 0;
      }
    }
    Lits[1] = Lits[1] + 1;
  } while( true );
}

Assistant:

int Abc_NtkAddOneHotness( Mfs_Man_t * p )
{
    Aig_Obj_t * pObj1, * pObj2;
    int i, k, Lits[2];
    for ( i = 0; i < Vec_PtrSize(p->pAigWin->vCis); i++ )
    for ( k = i+1; k < Vec_PtrSize(p->pAigWin->vCis); k++ )
    {
        pObj1 = Aig_ManCi( p->pAigWin, i );
        pObj2 = Aig_ManCi( p->pAigWin, k );
        Lits[0] = toLitCond( p->pCnf->pVarNums[pObj1->Id], 1 );
        Lits[1] = toLitCond( p->pCnf->pVarNums[pObj2->Id], 1 );
        if ( !sat_solver_addclause( p->pSat, Lits, Lits+2 ) )
        {
            sat_solver_delete( p->pSat );
            p->pSat = NULL;
            return 0;
        }
    }
    return 1;
}